

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

bool __thiscall QTextDocumentPrivate::unite(QTextDocumentPrivate *this,uint f)

{
  FragmentMap *this_00;
  long lVar1;
  char16_t cVar2;
  quint32 qVar3;
  QTextFragmentData *pQVar4;
  char16_t *pcVar5;
  uint z;
  
  this_00 = &this->fragments;
  z = QFragmentMapData<QTextFragmentData>::next(&this_00->data,f);
  if (z != 0) {
    pQVar4 = (this_00->data).field_0.fragments;
    if (pQVar4[z].format == pQVar4[f].format) {
      qVar3 = pQVar4[f].super_QFragment<1>.size_array[0];
      lVar1 = (long)(int)qVar3 + (long)pQVar4[f].stringPosition;
      if ((int)lVar1 == pQVar4[z].stringPosition) {
        pcVar5 = (this->text).d.ptr;
        cVar2 = pcVar5[pQVar4[f].stringPosition];
        if ((ushort)cVar2 - 0xfdd0 < 2) {
          return false;
        }
        if (cVar2 == L'\x2029') {
          return false;
        }
        cVar2 = pcVar5[lVar1];
        if ((ushort)cVar2 - 0xfdd0 < 2) {
          return false;
        }
        if (cVar2 == L'\x2029') {
          return false;
        }
        QFragmentMapData<QTextFragmentData>::setSize
                  (&this_00->data,f,qVar3 + pQVar4[z].super_QFragment<1>.size_array[0],0);
        QFragmentMapData<QTextFragmentData>::erase_single(&this_00->data,z);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool QTextDocumentPrivate::unite(uint f)
{
    uint n = fragments.next(f);
    if (!n)
        return false;

    QTextFragmentData *ff = fragments.fragment(f);
    QTextFragmentData *nf = fragments.fragment(n);

    if (nf->format == ff->format && (ff->stringPosition + (int)ff->size_array[0] == nf->stringPosition)) {
        if (isValidBlockSeparator(text.at(ff->stringPosition))
            || isValidBlockSeparator(text.at(nf->stringPosition)))
            return false;

        fragments.setSize(f, ff->size_array[0] + nf->size_array[0]);
        fragments.erase_single(n);
        return true;
    }
    return false;
}